

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

String * kj::_::generateExtensionRequest
                   (String *__return_storage_ptr__,ArrayPtr<kj::CompressionParameters> *extensions)

{
  bool bVar1;
  size_t size;
  String *pSVar2;
  kj *pkVar3;
  unsigned_long **ppuVar4;
  char (*in_RCX) [29];
  StringPtr *extraout_RDX;
  StringPtr *extraout_RDX_00;
  StringPtr *extraout_RDX_01;
  StringPtr *params;
  unsigned_long *in_R8;
  String local_140;
  unsigned_long *local_128;
  Fault local_120;
  unsigned_long *local_118;
  unsigned_long *_kj_result_1;
  unsigned_long w_1;
  String local_100;
  unsigned_long *local_e8;
  Fault local_e0;
  unsigned_long *local_d8;
  unsigned_long *_kj_result;
  unsigned_long w;
  String local_c0;
  String local_a8;
  String local_90;
  CompressionParameters *local_78;
  CompressionParameters *offer;
  CompressionParameters *__end2;
  CompressionParameters *local_58;
  CompressionParameters *__begin2;
  ArrayPtr<kj::CompressionParameters> *__range2;
  size_t i;
  Array<kj::String> offers;
  StringPtr EXT;
  ArrayPtr<kj::CompressionParameters> *extensions_local;
  
  offers.disposer = (ArrayDisposer *)anon_var_dwarf_84369b;
  size = ArrayPtr<kj::CompressionParameters>::size(extensions);
  heapArray<kj::String>((Array<kj::String> *)&i,size);
  __range2 = (ArrayPtr<kj::CompressionParameters> *)0x0;
  __begin2 = (CompressionParameters *)extensions;
  local_58 = ArrayPtr<kj::CompressionParameters>::begin(extensions);
  offer = ArrayPtr<kj::CompressionParameters>::end((ArrayPtr<kj::CompressionParameters> *)__begin2);
  params = extraout_RDX;
  do {
    if (local_58 == offer) {
      strArray<kj::Array<kj::String>&>
                (__return_storage_ptr__,(kj *)&i,(Array<kj::String> *)", ",*in_RCX);
      Array<kj::String>::~Array((Array<kj::String> *)&i);
      return __return_storage_ptr__;
    }
    local_78 = local_58;
    str<kj::StringPtr_const&>(&local_90,(kj *)&offers.disposer,params);
    pSVar2 = Array<kj::String>::operator[]((Array<kj::String> *)&i,(size_t)__range2);
    String::operator=(pSVar2,&local_90);
    String::~String(&local_90);
    if ((local_78->outboundNoContextTakeover & 1U) != 0) {
      pkVar3 = (kj *)Array<kj::String>::operator[]((Array<kj::String> *)&i,(size_t)__range2);
      str<kj::String&,char_const(&)[29]>
                (&local_a8,pkVar3,(String *)"; client_no_context_takeover",in_RCX);
      pSVar2 = Array<kj::String>::operator[]((Array<kj::String> *)&i,(size_t)__range2);
      String::operator=(pSVar2,&local_a8);
      String::~String(&local_a8);
    }
    if ((local_78->inboundNoContextTakeover & 1U) != 0) {
      pkVar3 = (kj *)Array<kj::String>::operator[]((Array<kj::String> *)&i,(size_t)__range2);
      str<kj::String&,char_const(&)[29]>
                (&local_c0,pkVar3,(String *)"; server_no_context_takeover",in_RCX);
      pSVar2 = Array<kj::String>::operator[]((Array<kj::String> *)&i,(size_t)__range2);
      String::operator=(pSVar2,&local_c0);
      String::~String(&local_c0);
    }
    bVar1 = Maybe<unsigned_long>::operator==(&local_78->outboundMaxWindowBits);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_d8 = readMaybe<unsigned_long>(&local_78->outboundMaxWindowBits);
      if (local_d8 == (unsigned_long *)0x0) {
        Debug::Fault::Fault(&local_e0,
                            "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                            ,0x13fd,FAILED,"offer.outboundMaxWindowBits != nullptr","");
        Debug::Fault::fatal(&local_e0);
      }
      ppuVar4 = mv<unsigned_long_const*>(&local_d8);
      local_e8 = *ppuVar4;
      _kj_result = (unsigned_long *)*local_e8;
      pkVar3 = (kj *)Array<kj::String>::operator[]((Array<kj::String> *)&i,(size_t)__range2);
      in_RCX = (char (*) [29])&_kj_result;
      str<kj::String&,char_const(&)[26],unsigned_long&>
                (&local_100,pkVar3,(String *)"; client_max_window_bits=",(char (*) [26])in_RCX,in_R8
                );
      pSVar2 = Array<kj::String>::operator[]((Array<kj::String> *)&i,(size_t)__range2);
      String::operator=(pSVar2,&local_100);
      String::~String(&local_100);
    }
    bVar1 = Maybe<unsigned_long>::operator==(&local_78->inboundMaxWindowBits);
    params = extraout_RDX_00;
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_118 = readMaybe<unsigned_long>(&local_78->inboundMaxWindowBits);
      if (local_118 == (unsigned_long *)0x0) {
        Debug::Fault::Fault(&local_120,
                            "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                            ,0x1401,FAILED,"offer.inboundMaxWindowBits != nullptr","");
        Debug::Fault::fatal(&local_120);
      }
      ppuVar4 = mv<unsigned_long_const*>(&local_118);
      local_128 = *ppuVar4;
      _kj_result_1 = (unsigned_long *)*local_128;
      pkVar3 = (kj *)Array<kj::String>::operator[]((Array<kj::String> *)&i,(size_t)__range2);
      in_RCX = (char (*) [29])&_kj_result_1;
      str<kj::String&,char_const(&)[26],unsigned_long&>
                (&local_140,pkVar3,(String *)"; server_max_window_bits=",(char (*) [26])in_RCX,in_R8
                );
      pSVar2 = Array<kj::String>::operator[]((Array<kj::String> *)&i,(size_t)__range2);
      String::operator=(pSVar2,&local_140);
      String::~String(&local_140);
      params = extraout_RDX_01;
    }
    __range2 = (ArrayPtr<kj::CompressionParameters> *)((long)&__range2->ptr + 1);
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

kj::String generateExtensionRequest(const ArrayPtr<CompressionParameters>& extensions) {
  // Build the `Sec-WebSocket-Extensions` request from the validated parameters.
  constexpr auto EXT = "permessage-deflate"_kj;
  auto offers = kj::heapArray<String>(extensions.size());
  size_t i = 0;
  for (const auto& offer : extensions) {
    offers[i] = kj::str(EXT);
    if (offer.outboundNoContextTakeover) {
      offers[i] = kj::str(offers[i], "; client_no_context_takeover");
    }
    if (offer.inboundNoContextTakeover) {
      offers[i] = kj::str(offers[i], "; server_no_context_takeover");
    }
    if (offer.outboundMaxWindowBits != kj::none) {
      auto w = KJ_ASSERT_NONNULL(offer.outboundMaxWindowBits);
      offers[i] = kj::str(offers[i], "; client_max_window_bits=", w);
    }
    if (offer.inboundMaxWindowBits != kj::none) {
      auto w = KJ_ASSERT_NONNULL(offer.inboundMaxWindowBits);
      offers[i] = kj::str(offers[i], "; server_max_window_bits=", w);
    }
    ++i;
  }
  return kj::strArray(offers, ", ");
}